

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QtGraphicsAnchorLayout::AnchorData_*>::clear
          (QList<QtGraphicsAnchorLayout::AnchorData_*> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<QtGraphicsAnchorLayout::AnchorData_*> *this_00;
  __off_t __length;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*>::swap
                (in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<QtGraphicsAnchorLayout::AnchorData_*> *)
                QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorData_*>::truncate
                (this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }